

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit
          (ConfigurePreset *this,int version,cmJSONState *state)

{
  bool bVar1;
  size_type sVar2;
  allocator<char> local_31;
  key_type local_30;
  
  if ((this->super_Preset).Hidden == false) {
    if (version < 3) {
      if ((this->Generator)._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"generator",&local_31);
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&(this->super_Preset).Name,&local_30,state);
      }
      else {
        if ((this->BinaryDir)._M_string_length != 0) goto LAB_002875a1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"binaryDir",&local_31);
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(&(this->super_Preset).Name,&local_30,state);
      }
      std::__cxx11::string::~string((string *)&local_30);
    }
    else {
LAB_002875a1:
      if ((((((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged != true) ||
            ((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_payload._M_value != false)) ||
           ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true)) ||
          ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_payload._M_value == false)) &&
         ((((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true ||
           ((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value != false)) ||
          (((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_engaged != true ||
           ((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool>._M_payload._M_value == false)))))) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
                ::count(&this->CacheVariables,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
        if (sVar2 == 0) goto LAB_00287573;
      }
    }
    bVar1 = false;
  }
  else {
LAB_00287573:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(
  int version, cmJSONState* state)
{
  auto& preset = *this;
  if (!preset.Hidden) {
    if (version < 3) {
      if (preset.Generator.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "generator",
                                                   state);
        return false;
      }
      if (preset.BinaryDir.empty()) {
        cmCMakePresetsErrors::PRESET_MISSING_FIELD(preset.Name, "binaryDir",
                                                   state);
        return false;
      }
    }

    if (preset.WarnDev == false && preset.ErrorDev == true) {
      return false;
    }
    if (preset.WarnDeprecated == false && preset.ErrorDeprecated == true) {
      return false;
    }
    if (preset.CacheVariables.count("") != 0) {
      return false;
    }
  }

  return true;
}